

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.h
# Opt level: O3

size_t __thiscall PostAggRegTuple_hash::operator()(PostAggRegTuple_hash *this,PostAggRegTuple *key)

{
  ulong uVar1;
  
  uVar1 = (key->local).first + 0x9e3779b9;
  uVar1 = (uVar1 >> 2) + 0x9e3779b9 + uVar1 * 0x40 + (key->local).second ^ uVar1;
  uVar1 = (uVar1 >> 2) + 0x9e3779b9 + uVar1 * 0x40 + (key->post).first ^ uVar1;
  return (uVar1 >> 2) + 0x9e3779b9 + uVar1 * 0x40 + (key->post).second ^ uVar1;
}

Assistant:

size_t operator()(const PostAggRegTuple &key ) const
    {
        size_t h = 0;
        h ^= std::hash<size_t>()(key.local.first)+ 0x9e3779b9 + (h<<6) + (h>>2);
        h ^= std::hash<size_t>()(key.local.second)+ 0x9e3779b9 + (h<<6) + (h>>2);
        h ^= std::hash<size_t>()(key.post.first)+ 0x9e3779b9 + (h<<6) + (h>>2);
        h ^= std::hash<size_t>()(key.post.second)+ 0x9e3779b9 + (h<<6) + (h>>2);
        return h;
    }